

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv_tcp_close_reset(uv_tcp_t *handle,uv_close_cb close_cb)

{
  int iVar1;
  int *piVar2;
  undefined8 local_2c;
  linger l;
  int fd;
  uv_close_cb close_cb_local;
  uv_tcp_t *handle_local;
  
  local_2c = 1;
  if (handle->shutdown_req == (uv_shutdown_t *)0x0) {
    l.l_onoff = (handle->io_watcher).fd;
    unique0x100000aa = close_cb;
    iVar1 = setsockopt(l.l_onoff,1,0xd,&local_2c,8);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x16) {
        piVar2 = __errno_location();
        return -*piVar2;
      }
      piVar2 = __errno_location();
      *piVar2 = 0;
    }
    uv_close((uv_handle_t *)handle,stack0xffffffffffffffe0);
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_close_reset(uv_tcp_t* handle, uv_close_cb close_cb) {
  int fd;
  struct linger l = { 1, 0 };

  /* Disallow setting SO_LINGER to zero due to some platform inconsistencies */
  if (uv__is_stream_shutting(handle))
    return UV_EINVAL;

  fd = uv__stream_fd(handle);
  if (0 != setsockopt(fd, SOL_SOCKET, SO_LINGER, &l, sizeof(l))) {
    if (errno == EINVAL) {
      /* Open Group Specifications Issue 7, 2018 edition states that
       * EINVAL may mean the socket has been shut down already.
       * Behavior observed on Solaris, illumos and macOS. */
      errno = 0;
    } else {
      return UV__ERR(errno);
    }
  }

  uv_close((uv_handle_t*) handle, close_cb);
  return 0;
}